

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O1

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_join
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,
          vertex_dist *v2,double len1,double len2)

{
  inner_join_e iVar1;
  point_base<double> *ppVar2;
  ulong uVar3;
  uint uVar4;
  line_join_e lj;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar5 = this->m_width;
  dVar18 = v1->x;
  dVar17 = v1->y;
  dVar6 = dVar17 - v0->y;
  dVar16 = (dVar5 * dVar6) / len1;
  dVar7 = dVar18 - v0->x;
  dVar12 = (dVar5 * dVar7) / len1;
  dVar9 = v2->y - dVar17;
  dVar14 = (dVar5 * dVar9) / len2;
  dVar8 = v2->x - dVar18;
  dVar10 = (dVar5 * dVar8) / len2;
  vc->m_size = 0;
  dVar6 = dVar8 * dVar6 - dVar9 * dVar7;
  if (((dVar6 == 0.0) && (!NAN(dVar6))) || (dVar5 <= 0.0 == 0.0 < dVar6)) {
    dVar18 = (dVar16 + dVar14) * 0.5;
    dVar17 = (dVar12 + dVar10) * 0.5;
    dVar5 = dVar18 * dVar18 + dVar17 * dVar17;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    lj = this->m_line_join;
    if (((lj & ~miter_join_revert) == round_join) &&
       ((this->m_width_abs - dVar5) * this->m_approx_scale < this->m_width_eps)) {
      dVar6 = v0->x + dVar16;
      dVar5 = v0->y - dVar12;
      dVar16 = dVar16 + v1->x;
      dVar12 = v1->y - dVar12;
      dVar7 = v1->x + dVar14;
      dVar9 = v1->y - dVar10;
      dVar15 = (dVar14 + v2->x) - dVar7;
      dVar14 = (v2->y - dVar10) - dVar9;
      dVar8 = dVar16 - dVar6;
      dVar11 = dVar12 - dVar5;
      dVar13 = dVar8 * dVar14 - dVar15 * dVar11;
      dVar10 = ABS(dVar13);
      if (1e-30 <= dVar10) {
        dVar13 = ((dVar5 - dVar9) * dVar15 - dVar14 * (dVar6 - dVar7)) / dVar13;
        dVar18 = dVar8 * dVar13 + dVar6;
        dVar17 = dVar13 * dVar11 + dVar5;
      }
      uVar4 = vc->m_size >> 6;
      if (dVar10 < 1e-30) {
        if (vc->m_num_blocks <= uVar4) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar4);
        }
        ppVar2 = vc->m_blocks[uVar4];
        uVar4 = vc->m_size;
        uVar3 = (ulong)((uVar4 & 0x3f) << 4);
        *(double *)((long)&ppVar2->x + uVar3) = dVar16;
        *(double *)((long)&ppVar2->y + uVar3) = dVar12;
      }
      else {
        if (vc->m_num_blocks <= uVar4) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar4);
        }
        ppVar2 = vc->m_blocks[uVar4];
        uVar4 = vc->m_size;
        uVar3 = (ulong)((uVar4 & 0x3f) << 4);
        *(double *)((long)&ppVar2->x + uVar3) = dVar18;
        *(double *)((long)&ppVar2->y + uVar3) = dVar17;
      }
      goto LAB_00118a34;
    }
    if (miter_join_revert < lj) {
      if (lj == round_join) {
        calc_arc(this,vc,v1->x,v1->y,dVar16,-dVar12,dVar14,-dVar10);
        return;
      }
      if (lj != miter_join_round) {
        dVar5 = v1->x;
        dVar18 = v1->y;
        uVar4 = vc->m_size >> 6;
        if (vc->m_num_blocks <= uVar4) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar4);
        }
        ppVar2 = vc->m_blocks[uVar4];
        uVar4 = vc->m_size;
        uVar3 = (ulong)((uVar4 & 0x3f) << 4);
        *(double *)((long)&ppVar2->x + uVar3) = dVar16 + dVar5;
        *(double *)((long)&ppVar2->y + uVar3) = dVar18 - dVar12;
        goto LAB_001189d5;
      }
    }
    dVar6 = this->m_miter_limit;
    goto LAB_0011883a;
  }
  dVar5 = len1;
  if (len2 <= len1) {
    dVar5 = len2;
  }
  dVar5 = dVar5 / this->m_width_abs;
  dVar6 = this->m_inner_miter_limit;
  if (this->m_inner_miter_limit <= dVar5) {
    dVar6 = dVar5;
  }
  iVar1 = this->m_inner_join;
  if (iVar1 - inner_jag < 2) {
    dVar5 = (dVar16 - dVar14) * (dVar16 - dVar14) + (dVar12 - dVar10) * (dVar12 - dVar10);
    if ((dVar5 < len1 * len1) && (dVar5 < len2 * len2)) {
LAB_0011880e:
      dVar5 = 0.0;
      lj = miter_join_revert;
LAB_0011883a:
      calc_miter(this,vc,v0,v1,v2,dVar16,dVar12,dVar14,dVar10,lj,dVar6,dVar5);
      return;
    }
    if (iVar1 != inner_jag) {
      if (vc->m_num_blocks == 0) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
      }
      ppVar2 = *vc->m_blocks;
      uVar4 = vc->m_size;
      uVar3 = (ulong)((uVar4 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar3) = dVar18 + dVar16;
      *(double *)((long)&ppVar2->y + uVar3) = dVar17 - dVar12;
      uVar4 = uVar4 + 1;
      vc->m_size = uVar4;
      dVar5 = v1->x;
      dVar18 = v1->y;
      uVar4 = uVar4 >> 6;
      if (vc->m_num_blocks <= uVar4) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar4);
      }
      ppVar2 = vc->m_blocks[uVar4];
      uVar4 = vc->m_size;
      uVar3 = (ulong)((uVar4 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar3) = dVar5;
      *(double *)((long)&ppVar2->y + uVar3) = dVar18;
      vc->m_size = uVar4 + 1;
      calc_arc(this,vc,v1->x,v1->y,dVar14,-dVar10,dVar16,-dVar12);
      dVar5 = v1->x;
      dVar18 = v1->y;
      uVar4 = vc->m_size >> 6;
      if (vc->m_num_blocks <= uVar4) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar4);
      }
      ppVar2 = vc->m_blocks[uVar4];
      uVar4 = vc->m_size;
      uVar3 = (ulong)((uVar4 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar3) = dVar5;
      *(double *)((long)&ppVar2->y + uVar3) = dVar18;
      uVar4 = uVar4 + 1;
      vc->m_size = uVar4;
      dVar5 = v1->x;
      dVar18 = v1->y;
      uVar4 = uVar4 >> 6;
      if (vc->m_num_blocks <= uVar4) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar4);
      }
      ppVar2 = vc->m_blocks[uVar4];
      uVar4 = vc->m_size;
      uVar3 = (ulong)((uVar4 & 0x3f) << 4);
      *(double *)((long)&ppVar2->x + uVar3) = dVar14 + dVar5;
      *(double *)((long)&ppVar2->y + uVar3) = dVar18 - dVar10;
      goto LAB_00118a34;
    }
    if (vc->m_num_blocks == 0) {
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
    }
    ppVar2 = *vc->m_blocks;
    uVar4 = vc->m_size;
    uVar3 = (ulong)((uVar4 & 0x3f) << 4);
    *(double *)((long)&ppVar2->x + uVar3) = dVar18 + dVar16;
    *(double *)((long)&ppVar2->y + uVar3) = dVar17 - dVar12;
    uVar4 = uVar4 + 1;
    vc->m_size = uVar4;
    dVar5 = v1->x;
    dVar18 = v1->y;
    uVar4 = uVar4 >> 6;
    if (vc->m_num_blocks <= uVar4) {
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar4);
    }
    ppVar2 = vc->m_blocks[uVar4];
    uVar4 = vc->m_size;
    uVar3 = (ulong)((uVar4 & 0x3f) << 4);
    *(double *)((long)&ppVar2->x + uVar3) = dVar5;
    *(double *)((long)&ppVar2->y + uVar3) = dVar18;
  }
  else {
    if (iVar1 == inner_miter) goto LAB_0011880e;
    if (vc->m_num_blocks == 0) {
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
    }
    ppVar2 = *vc->m_blocks;
    uVar4 = vc->m_size;
    uVar3 = (ulong)((uVar4 & 0x3f) << 4);
    *(double *)((long)&ppVar2->x + uVar3) = dVar18 + dVar16;
    *(double *)((long)&ppVar2->y + uVar3) = dVar17 - dVar12;
  }
LAB_001189d5:
  vc->m_size = uVar4 + 1;
  dVar5 = v1->x;
  dVar18 = v1->y;
  uVar4 = uVar4 + 1 >> 6;
  if (vc->m_num_blocks <= uVar4) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar4);
  }
  ppVar2 = vc->m_blocks[uVar4];
  uVar4 = vc->m_size;
  uVar3 = (ulong)((uVar4 & 0x3f) << 4);
  *(double *)((long)&ppVar2->x + uVar3) = dVar14 + dVar5;
  *(double *)((long)&ppVar2->y + uVar3) = dVar18 - dVar10;
LAB_00118a34:
  vc->m_size = uVar4 + 1;
  return;
}

Assistant:

void math_stroke<VC>::calc_join(VC& vc,
                                    const vertex_dist& v0, 
                                    const vertex_dist& v1, 
                                    const vertex_dist& v2,
                                    double len1, 
                                    double len2)
    {
        double dx1 = m_width * (v1.y - v0.y) / len1;
        double dy1 = m_width * (v1.x - v0.x) / len1;
        double dx2 = m_width * (v2.y - v1.y) / len2;
        double dy2 = m_width * (v2.x - v1.x) / len2;

        vc.remove_all();

        double cp = cross_product(v0.x, v0.y, v1.x, v1.y, v2.x, v2.y);
        if(cp != 0 && (cp > 0) == (m_width > 0))
        {
            // Inner join
            //---------------
            double limit = ((len1 < len2) ? len1 : len2) / m_width_abs;
            if(limit < m_inner_miter_limit)
            {
                limit = m_inner_miter_limit;
            }

            switch(m_inner_join)
            {
            default: // inner_bevel
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;

            case inner_miter:
                calc_miter(vc,
                           v0, v1, v2, dx1, dy1, dx2, dy2, 
                           miter_join_revert, 
                           limit, 0);
                break;

            case inner_jag:
            case inner_round:
                cp = (dx1-dx2) * (dx1-dx2) + (dy1-dy2) * (dy1-dy2);
                if(cp < len1 * len1 && cp < len2 * len2)
                {
                    calc_miter(vc,
                               v0, v1, v2, dx1, dy1, dx2, dy2, 
                               miter_join_revert, 
                               limit, 0);
                }
                else
                {
                    if(m_inner_join == inner_jag)
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        add_vertex(vc, v1.x + dx2, v1.y - dy2);
                    }
                    else
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        calc_arc(vc, v1.x, v1.y, dx2, -dy2, dx1, -dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        add_vertex(vc, v1.x + dx2, v1.y - dy2);
                    }
                }
                break;
            }
        }
        else
        {
            // Outer join
            //---------------

            // Calculate the distance between v1 and 
            // the central point of the bevel line segment
            //---------------
            double dx = (dx1 + dx2) / 2;
            double dy = (dy1 + dy2) / 2;
            double dbevel = sqrt(dx * dx + dy * dy);

            if(m_line_join == round_join || m_line_join == bevel_join)
            {
                // This is an optimization that reduces the number of points 
                // in cases of almost collinear segments. If there's no
                // visible difference between bevel and miter joins we'd rather
                // use miter join because it adds only one point instead of two. 
                //
                // Here we calculate the middle point between the bevel points 
                // and then, the distance between v1 and this middle point. 
                // At outer joins this distance always less than stroke width, 
                // because it's actually the height of an isosceles triangle of
                // v1 and its two bevel points. If the difference between this
                // width and this value is small (no visible bevel) we can 
                // add just one point. 
                //
                // The constant in the expression makes the result approximately 
                // the same as in round joins and caps. You can safely comment 
                // out this entire "if".
                //-------------------
                if(m_approx_scale * (m_width_abs - dbevel) < m_width_eps)
                {
                    if(calc_intersection(v0.x + dx1, v0.y - dy1,
                                         v1.x + dx1, v1.y - dy1,
                                         v1.x + dx2, v1.y - dy2,
                                         v2.x + dx2, v2.y - dy2,
                                         &dx, &dy))
                    {
                        add_vertex(vc, dx, dy);
                    }
                    else
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                    }
                    return;
                }
            }

            switch(m_line_join)
            {
            case miter_join:
            case miter_join_revert:
            case miter_join_round:
                calc_miter(vc, 
                           v0, v1, v2, dx1, dy1, dx2, dy2, 
                           m_line_join, 
                           m_miter_limit,
                           dbevel);
                break;

            case round_join:
                calc_arc(vc, v1.x, v1.y, dx1, -dy1, dx2, -dy2);
                break;

            default: // Bevel join
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;
            }
        }
    }